

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_collect_dirs(vdd *vdd,isoent *rootent,int depth)

{
  int in_EDX;
  isoent *in_RSI;
  undefined8 *in_RDI;
  isoent *np;
  isoent *local_20;
  int local_14;
  isoent *local_10;
  
  local_10 = in_RSI;
  if (in_RSI == (isoent *)0x0) {
    local_10 = (isoent *)*in_RDI;
  }
  local_20 = local_10;
  local_14 = in_EDX;
  do {
    path_table_add_entry((path_table *)(in_RDI[2] + (long)local_14 * 0x20),local_20);
    if (((local_20->subdirs).first == (isoent *)0x0) || (*(int *)(in_RDI + 3) <= local_14 + 1)) {
      for (; local_20 != local_10; local_20 = local_20->parent) {
        if (local_20->drnext != (isoent *)0x0) {
          local_20 = local_20->drnext;
          break;
        }
        local_14 = local_14 + -1;
      }
    }
    else {
      local_20 = (local_20->subdirs).first;
      local_14 = local_14 + 1;
    }
    if (local_20 == local_10) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
isoent_collect_dirs(struct vdd *vdd, struct isoent *rootent, int depth)
{
	struct isoent *np;

	if (rootent == NULL)
		rootent = vdd->rootent;
	np = rootent;
	do {
		/* Register current directory to pathtable. */
		path_table_add_entry(&(vdd->pathtbl[depth]), np);

		if (np->subdirs.first != NULL && depth + 1 < vdd->max_depth) {
			/* Enter to sub directories. */
			np = np->subdirs.first;
			depth++;
			continue;
		}
		while (np != rootent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != rootent);

	return (ARCHIVE_OK);
}